

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O3

type unodb::qsbr_state::inc_epoch_reset_previous(type word)

{
  byte bVar1;
  qsbr_epoch other;
  bool bVar2;
  undefined8 in_RAX;
  uint uVar3;
  undefined8 uStack_28;
  
  uVar3 = (uint)(word >> 0x20);
  if ((uVar3 & 0x3fffffff) < ((uint)word & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if ((word & 0x3fffffff) == 0) {
    bVar1 = (byte)(word >> 0x3e) + 1;
    other.epoch_val = bVar1 & 3;
    uStack_28._0_7_ = (undefined7)in_RAX;
    uStack_28 = CONCAT17(bVar1,(undefined7)uStack_28) & 0x3ffffffffffffff;
    bVar2 = detail::qsbr_epoch::operator==((qsbr_epoch *)((long)&uStack_28 + 7),other);
    if (bVar2) {
      return (ulong)(uVar3 & 0x3fffffff) |
             word & 0x3fffffff00000000 | (ulong)other.epoch_val << 0x3e;
    }
    __assert_fail("get_epoch(result) == old_epoch.advance()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x161,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  __assert_fail("get_threads_in_previous_epoch(word) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x157,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_epoch_reset_previous(
      type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 0);

    const auto old_epoch = get_epoch(word);
    const auto new_epoch_in_word = make_from_epoch(old_epoch.advance());
    const auto new_thread_count_in_word = word & thread_count_in_word_mask;
    const auto new_threads_in_previous = (word >> thread_count_in_word_offset) &
                                         threads_in_previous_epoch_in_word_mask;
    const auto result =
        new_epoch_in_word | new_thread_count_in_word | new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(result) == old_epoch.advance());
    UNODB_DETAIL_ASSERT(get_thread_count(result) == get_thread_count(word));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }